

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putkey.c
# Opt level: O0

int ffptdm(fitsfile *fptr,int colnum,int naxis,long *naxes,int *status)

{
  size_t sVar1;
  size_t sVar2;
  long lVar3;
  long in_RCX;
  int in_EDX;
  int in_ESI;
  int *in_RDI;
  int *in_R8;
  tcolumn *colptr;
  long repeat;
  long totalpix;
  int ii;
  char message [81];
  char value [80];
  char comm [73];
  char tdimstr [71];
  char keyname [75];
  long local_1e0;
  long local_1d8;
  undefined4 in_stack_fffffffffffffe30;
  int iVar4;
  char *in_stack_fffffffffffffe38;
  int in_stack_fffffffffffffe44;
  int *in_stack_fffffffffffffe48;
  char *in_stack_fffffffffffffe50;
  char *in_stack_fffffffffffffe58;
  char *in_stack_fffffffffffffe60;
  fitsfile *in_stack_fffffffffffffe68;
  int *in_stack_fffffffffffffe70;
  int *in_stack_fffffffffffffe78;
  int in_stack_fffffffffffffe84;
  fitsfile *in_stack_fffffffffffffe88;
  char local_168 [16];
  int *in_stack_fffffffffffffea8;
  char *in_stack_fffffffffffffeb0;
  char *in_stack_fffffffffffffeb8;
  char *in_stack_fffffffffffffec0;
  fitsfile *in_stack_fffffffffffffec8;
  int *in_stack_fffffffffffffee8;
  long *in_stack_fffffffffffffef0;
  long *in_stack_fffffffffffffef8;
  int *in_stack_ffffffffffffff00;
  char *in_stack_ffffffffffffff08;
  int *in_stack_ffffffffffffff10;
  fitsfile *in_stack_ffffffffffffff18;
  char local_c8 [160];
  int *local_28;
  long local_20;
  int local_18;
  int local_14;
  int *local_10;
  int local_4;
  
  local_1d8 = 1;
  if (*in_R8 < 1) {
    local_28 = in_R8;
    if ((in_ESI < 1) || (999 < in_ESI)) {
      ffpmsg((char *)0x23642c);
      *local_28 = 0x12e;
      local_4 = 0x12e;
    }
    else if (in_EDX < 1) {
      ffpmsg((char *)0x236460);
      *local_28 = 0x140;
      local_4 = 0x140;
    }
    else {
      local_20 = in_RCX;
      local_18 = in_EDX;
      local_14 = in_ESI;
      local_10 = in_RDI;
      if (*in_RDI == *(int *)(*(long *)(in_RDI + 2) + 0x54)) {
        if ((*(long *)(*(long *)(in_RDI + 2) + 0x88) == -1) &&
           (iVar4 = ffrdef(in_stack_ffffffffffffff18,in_stack_ffffffffffffff10), 0 < iVar4)) {
          return *local_28;
        }
      }
      else {
        ffmahd(in_stack_fffffffffffffe88,in_stack_fffffffffffffe84,in_stack_fffffffffffffe78,
               in_stack_fffffffffffffe70);
      }
      if (*(int *)(*(long *)(local_10 + 2) + 0x58) == 2) {
        strcpy(local_c8,"(");
        for (iVar4 = 0; iVar4 < local_18; iVar4 = iVar4 + 1) {
          if (0 < iVar4) {
            strcat(local_c8,",");
          }
          if (*(long *)(local_20 + (long)iVar4 * 8) < 0) {
            ffpmsg((char *)0x2365af);
            *local_28 = 0x107;
            return 0x107;
          }
          snprintf(local_168,0x50,"%ld",*(undefined8 *)(local_20 + (long)iVar4 * 8));
          sVar1 = strlen(local_c8);
          sVar2 = strlen(local_168);
          if (0x46 < sVar1 + sVar2 + 1) {
            ffpmsg((char *)0x236639);
            *local_28 = 0x107;
            return 0x107;
          }
          strcat(local_c8,local_168);
          local_1d8 = *(long *)(local_20 + (long)iVar4 * 8) * local_1d8;
        }
        lVar3 = *(long *)(*(long *)(local_10 + 2) + 0x3d0) + (long)(local_14 + -1) * 0xa0;
        if (*(long *)(lVar3 + 0x58) != local_1d8) {
          ffkeyn((char *)in_stack_fffffffffffffe48,in_stack_fffffffffffffe44,
                 in_stack_fffffffffffffe38,(int *)CONCAT44(iVar4,in_stack_fffffffffffffe30));
          ffgkys(in_stack_fffffffffffffe68,in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
                 in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
          ffbnfm(in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,
                 in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
          if ((0 < *local_28) || (local_1e0 != local_1d8)) {
            snprintf(&stack0xfffffffffffffe38,0x51,
                     "column vector length, %ld, does not equal TDIMn array size, %ld",
                     *(undefined8 *)(lVar3 + 0x58),local_1d8);
            ffpmsg((char *)0x23679b);
            *local_28 = 0x107;
            return 0x107;
          }
        }
        strcat(local_c8,")");
        strcpy(&stack0xfffffffffffffee8,"size of the multidimensional array");
        ffkeyn((char *)in_stack_fffffffffffffe48,in_stack_fffffffffffffe44,in_stack_fffffffffffffe38
               ,(int *)CONCAT44(iVar4,in_stack_fffffffffffffe30));
        ffpkys(in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,
               in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
        local_4 = *local_28;
      }
      else {
        ffpmsg((char *)0x236529);
        *local_28 = 0xe3;
        local_4 = 0xe3;
      }
    }
  }
  else {
    local_4 = *in_R8;
  }
  return local_4;
}

Assistant:

int ffptdm( fitsfile *fptr, /* I - FITS file pointer                        */
            int colnum,     /* I - column number                            */
            int naxis,      /* I - number of axes in the data array         */
            long naxes[],   /* I - length of each data axis                 */
            int *status)    /* IO - error status                            */
/*
  write the TDIMnnn keyword describing the dimensionality of a column
*/
{
    char keyname[FLEN_KEYWORD], tdimstr[FLEN_VALUE], comm[FLEN_COMMENT];
    char value[80], message[FLEN_ERRMSG];
    int ii;
    long totalpix = 1, repeat;
    tcolumn *colptr;

    if (*status > 0)
        return(*status);

    if (colnum < 1 || colnum > 999)
    {
        ffpmsg("column number is out of range 1 - 999 (ffptdm)");
        return(*status = BAD_COL_NUM);
    }

    if (naxis < 1)
    {
        ffpmsg("naxis is less than 1 (ffptdm)");
        return(*status = BAD_DIMEN);
    }

    /* reset position to the correct HDU if necessary */
    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);
    else if ((fptr->Fptr)->datastart == DATA_UNDEFINED)
        if ( ffrdef(fptr, status) > 0)               /* rescan header */
            return(*status);

    if ( (fptr->Fptr)->hdutype != BINARY_TBL)
    {
       ffpmsg(
    "Error: The TDIMn keyword is only allowed in BINTABLE extensions (ffptdm)");
       return(*status = NOT_BTABLE);
    }

    strcpy(tdimstr, "(");            /* start constructing the TDIM value */   

    for (ii = 0; ii < naxis; ii++)
    {
        if (ii > 0)
            strcat(tdimstr, ",");   /* append the comma separator */

        if (naxes[ii] < 0)
        {
            ffpmsg("one or more TDIM values are less than 0 (ffptdm)");
            return(*status = BAD_TDIM);
        }

        snprintf(value, 80,"%ld", naxes[ii]);
        /* This will either be followed by a ',' or ')'. */
        if (strlen(tdimstr)+strlen(value)+1 > FLEN_VALUE-1)
        {
            ffpmsg("TDIM string too long (ffptdm)");
            return(*status = BAD_TDIM);
        }
        strcat(tdimstr, value);     /* append the axis size */

        totalpix *= naxes[ii];
    }

    colptr = (fptr->Fptr)->tableptr;  /* point to first column structure */
    colptr += (colnum - 1);      /* point to the specified column number */

    if ((long) colptr->trepeat != totalpix)
    {
      /* There is an apparent inconsistency between TDIMn and TFORMn. */
      /* The colptr->trepeat value may be out of date, so re-read     */
      /* the TFORMn keyword to be sure.                               */

      ffkeyn("TFORM", colnum, keyname, status);   /* construct TFORMn name  */
      ffgkys(fptr, keyname, value, NULL, status); /* read TFORMn keyword    */
      ffbnfm(value, NULL, &repeat, NULL, status); /* parse the repeat count */

      if (*status > 0 || repeat != totalpix)
      {
        snprintf(message,FLEN_ERRMSG,
        "column vector length, %ld, does not equal TDIMn array size, %ld",
        (long) colptr->trepeat, totalpix);
        ffpmsg(message);
        return(*status = BAD_TDIM);
      }
    }

    strcat(tdimstr, ")" );            /* append the closing parenthesis */

    strcpy(comm, "size of the multidimensional array");
    ffkeyn("TDIM", colnum, keyname, status);      /* construct TDIMn name */
    ffpkys(fptr, keyname, tdimstr, comm, status);  /* write the keyword */
    return(*status);
}